

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  string result;
  string name;
  undefined1 local_a0 [32];
  string local_80;
  undefined1 local_60 [32];
  string local_40;
  
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)this,field);
  anon_unknown_0::UnderscoresToCamelCase(&local_80,&local_40,false);
  if (*(int *)(this + 0x3c) == 3) {
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60._0_8_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_a0,
                 (FieldDescriptor **)local_60);
    }
    if ((*(int *)(this + 0x38) == 0xb) &&
       (bVar1 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this), bVar1))
    goto LAB_0026368a;
  }
  else {
LAB_0026368a:
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Array","");
    if (local_80._M_string_length < (ulong)local_a0._8_8_) {
      bVar1 = false;
    }
    else {
      iVar2 = std::__cxx11::string::compare
                        ((ulong)&local_80,local_80._M_string_length - local_a0._8_8_,
                         (string *)local_a0._8_8_);
      bVar1 = iVar2 == 0;
    }
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    if (!bVar1) goto LAB_002636fb;
  }
  std::__cxx11::string::append((char *)&local_80);
LAB_002636fb:
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  local_60._0_8_ = (FieldDescriptor *)(local_60 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"_p","");
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,(string *)local_a0,&local_80,(string *)local_60,(string *)0x0);
  if ((FieldDescriptor *)local_60._0_8_ != (FieldDescriptor *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldName(const FieldDescriptor* field) {
  const string name = NameFromFieldDescriptor(field);
  string result = UnderscoresToCamelCase(name, false);
  if (field->is_repeated() && !field->is_map()) {
    // Add "Array" before do check for reserved worlds.
    result += "Array";
  } else {
    // If it wasn't repeated, but ends in "Array", force on the _p suffix.
    if (HasSuffixString(result, "Array")) {
      result += "_p";
    }
  }
  return SanitizeNameForObjC("", result, "_p", NULL);
}